

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value.c
# Opt level: O0

void value_move(value src,value dst)

{
  value_impl pvVar1;
  value_impl pvVar2;
  value in_RSI;
  value in_RDI;
  value_impl impl_dst;
  value_impl impl_src;
  
  if ((in_RDI != (value)0x0) && (in_RSI != (value)0x0)) {
    pvVar1 = value_descriptor(in_RDI);
    pvVar2 = value_descriptor(in_RSI);
    pvVar2->finalizer = pvVar1->finalizer;
    pvVar2->finalizer_data = pvVar1->finalizer_data;
    pvVar1->finalizer = (value_finalizer_cb)0x0;
    pvVar1->finalizer_data = (void *)0x0;
  }
  return;
}

Assistant:

void value_move(value src, value dst)
{
	if (src != NULL && dst != NULL)
	{
		value_impl impl_src = value_descriptor(src);
		value_impl impl_dst = value_descriptor(dst);

		impl_dst->finalizer = impl_src->finalizer;
		impl_dst->finalizer_data = impl_src->finalizer_data;

		impl_src->finalizer = NULL;
		impl_src->finalizer_data = NULL;
	}
}